

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O3

void __thiscall uint256_tests::basics::test_method(basics *this)

{
  shared_ptr<boost::basic_wrap_stringstream<char>_> sVar1;
  int iVar2;
  uint uVar3;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  readonly_property<bool> rVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  ne_impl local_121;
  lazy_ostream local_120;
  undefined1 *local_110;
  string **local_108;
  string *local_100;
  string *local_f8;
  char *local_f0;
  string *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  string **local_c8;
  undefined1 local_c0 [9];
  undefined1 auStack_b7 [7];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  char local_a0;
  undefined1 local_98 [9];
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_88;
  undefined1 local_78 [16];
  shared_count sStack_68;
  undefined8 uStack_60;
  undefined1 local_50 [9];
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  shared_count asStack_40 [2];
  undefined1 **ppuVar4;
  
  asStack_40[1].pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_130 = "";
  ppuVar4 = &local_148;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x42;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)ppuVar4,msg);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,&R1L);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)R1Array,(uchar *)0x20,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  aStack_b0._8_8_ = &local_e8;
  stack0xffffffffffffff48 = _auStack_b7 << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xe38a97,(size_t)&local_f8,0x42,
             local_c0,"ArrayToString(R1Array,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_150 = "";
  ppuVar4 = &local_168;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x43;
  file_00.m_begin = (iterator)&local_158;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)ppuVar4,msg_00);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,R1S);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)R1Array,(uchar *)0x14,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48bce,(size_t)&local_f8,0x43,
             local_c0,"ArrayToString(R1Array,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_178 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_170 = "";
  ppuVar4 = &local_188;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x44;
  file_01.m_begin = (iterator)&local_178;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar4,msg_01);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,&R2L);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)R2Array,(uchar *)0x20,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xe38ab6,(size_t)&local_f8,0x44,
             local_c0,"ArrayToString(R2Array,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_190 = "";
  ppuVar4 = &local_1a8;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x45;
  file_02.m_begin = (iterator)&local_198;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar4,msg_02);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,R2S);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)R2Array,(uchar *)0x14,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48bf7,(size_t)&local_f8,0x45,
             local_c0,"ArrayToString(R2Array,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1b0 = "";
  ppuVar4 = &local_1c8;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x46;
  file_03.m_begin = (iterator)&local_1b8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)ppuVar4,msg_03);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,ZeroL);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48c20,(size_t)&local_f8,0x46,
             local_c0,"ArrayToString(ZeroArray,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_1d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d0 = "";
  ppuVar4 = &local_1e8;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x47;
  file_04.m_begin = (iterator)&local_1d8;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)ppuVar4,msg_04);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,ZeroS);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48c31,(size_t)&local_f8,0x47,
             local_c0,"ArrayToString(ZeroArray,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f0 = "";
  ppuVar4 = &local_208;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x48;
  file_05.m_begin = (iterator)&local_1f8;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar4,msg_05);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,OneL);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)OneArray,(uchar *)0x20,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xe38ad6,(size_t)&local_f8,0x48,
             local_c0,"ArrayToString(OneArray,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_210 = "";
  ppuVar4 = &local_228;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x49;
  file_06.m_begin = (iterator)&local_218;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)ppuVar4,msg_06);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,OneS);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)OneArray,(uchar *)0x14,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48c5e,(size_t)&local_f8,0x49,
             local_c0,"ArrayToString(OneArray,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_230 = "";
  ppuVar4 = &local_248;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x4a;
  file_07.m_begin = (iterator)&local_238;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar4,msg_07);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,MaxL);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)MaxArray,(uchar *)0x20,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xe38af7,(size_t)&local_f8,0x4a,
             local_c0,"ArrayToString(MaxArray,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_250 = "";
  ppuVar4 = &local_268;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x4b;
  file_08.m_begin = (iterator)&local_258;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar4,msg_08);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,MaxS);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)MaxArray,(uchar *)0x14,uVar3);
  if ((element_type *)local_78._8_8_ == stack0xffffffffffffff70) {
    if ((element_type *)local_78._8_8_ == (element_type *)0x0) {
      rVar7.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar2 = bcmp((void *)local_78._0_8_,(void *)local_98._0_8_,local_78._8_8_);
      rVar7.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
    }
  }
  else {
    rVar7.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_50[0] = (readonly_property<bool>)
                (readonly_property<bool>)rVar7.super_class_property<bool>.value;
  stack0xffffffffffffffb8 = (element_type *)0x0;
  asStack_40[0].pi_ = (sp_counted_base *)0x0;
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_100 = (string *)local_98;
  local_e8 = (string *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,2,REQUIRE,0xf48c89,(size_t)&local_f8,0x4b,
             local_c0,"ArrayToString(MaxArray,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_270 = "";
  ppuVar4 = &local_288;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x4c;
  file_09.m_begin = (iterator)&local_278;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar4,msg_09);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_78,OneL);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)ZeroArray,(uchar *)0x20,uVar3);
  boost::test_tools::tt_detail::ne_impl::operator()
            ((assertion_result *)local_50,&local_121,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,3,REQUIRE,0xe38ad6,(size_t)&local_f8,0x4c,
             local_c0,"ArrayToString(ZeroArray,32)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_290 = "";
  ppuVar4 = &local_2a8;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x4d;
  file_10.m_begin = (iterator)&local_298;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar4,msg_10);
  uVar3 = (uint)ppuVar4;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,OneS);
  ArrayToString_abi_cxx11_((string *)local_98,(uint256_tests *)ZeroArray,(uchar *)0x14,uVar3);
  boost::test_tools::tt_detail::ne_impl::operator()
            ((assertion_result *)local_50,&local_121,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  local_f8 = (string *)0xf48b67;
  local_f0 = "";
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = &local_e8;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01388fc8;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_50,&local_120,1,3,REQUIRE,0xf48c5e,(size_t)&local_f8,0x4d,
             local_c0,"ArrayToString(ZeroArray,20)",&local_e0);
  boost::detail::shared_count::~shared_count(asStack_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ != &aStack_88) {
    operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
  }
  if ((shared_count *)local_78._0_8_ != &sStack_68) {
    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
  }
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = &DAT_00000050;
  file_11.m_begin = (iterator)&local_2b8;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2c8,
             msg_11);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  auVar10[0] = -(R2L == R1L);
  auVar10[1] = -(cRam00000000013a24ce == cRam00000000013a249a);
  auVar10[2] = -(cRam00000000013a24cf == cRam00000000013a249b);
  auVar10[3] = -(cRam00000000013a24d0 == cRam00000000013a249c);
  auVar10[4] = -(cRam00000000013a24d1 == cRam00000000013a249d);
  auVar10[5] = -(cRam00000000013a24d2 == cRam00000000013a249e);
  auVar10[6] = -(cRam00000000013a24d3 == cRam00000000013a249f);
  auVar10[7] = -(cRam00000000013a24d4 == cRam00000000013a24a0);
  auVar10[8] = -(cRam00000000013a24d5 == cRam00000000013a24a1);
  auVar10[9] = -(cRam00000000013a24d6 == cRam00000000013a24a2);
  auVar10[10] = -(cRam00000000013a24d7 == cRam00000000013a24a3);
  auVar10[0xb] = -(cRam00000000013a24d8 == cRam00000000013a24a4);
  auVar10[0xc] = -(cRam00000000013a24d9 == cRam00000000013a24a5);
  auVar10[0xd] = -(cRam00000000013a24da == cRam00000000013a24a6);
  auVar10[0xe] = -(cRam00000000013a24db == cRam00000000013a24a7);
  auVar10[0xf] = -(cRam00000000013a24dc == cRam00000000013a24a8);
  auVar29[0] = -(DAT_013a24dd == DAT_013a24a9);
  auVar29[1] = -(cRam00000000013a24de == cRam00000000013a24aa);
  auVar29[2] = -(cRam00000000013a24df == cRam00000000013a24ab);
  auVar29[3] = -(cRam00000000013a24e0 == cRam00000000013a24ac);
  auVar29[4] = -(cRam00000000013a24e1 == cRam00000000013a24ad);
  auVar29[5] = -(cRam00000000013a24e2 == cRam00000000013a24ae);
  auVar29[6] = -(cRam00000000013a24e3 == cRam00000000013a24af);
  auVar29[7] = -(cRam00000000013a24e4 == cRam00000000013a24b0);
  auVar29[8] = -(cRam00000000013a24e5 == cRam00000000013a24b1);
  auVar29[9] = -(cRam00000000013a24e6 == cRam00000000013a24b2);
  auVar29[10] = -(cRam00000000013a24e7 == cRam00000000013a24b3);
  auVar29[0xb] = -(cRam00000000013a24e8 == cRam00000000013a24b4);
  auVar29[0xc] = -(cRam00000000013a24e9 == cRam00000000013a24b5);
  auVar29[0xd] = -(cRam00000000013a24ea == cRam00000000013a24b6);
  auVar29[0xe] = -(cRam00000000013a24eb == cRam00000000013a24b7);
  auVar29[0xf] = -(DAT_013a24ec == DAT_013a24b8);
  auVar29 = auVar29 & auVar10;
  bVar8 = (ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  local_108 = (string **)0xf4aea1;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_78[0] = (class_property<bool>)(class_property<bool>)!bVar8;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = &R1L;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)&R2L;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01389a00;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xe39232,(size_t)local_98,0x50,
             local_c0,"R2L",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = &DAT_00000050;
  file_12.m_begin = (iterator)&local_2d8;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2e8,
             msg_12);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  auVar11[0] = -(R2S[0] == R1S[0]);
  auVar11[1] = -(R2S[1] == R1S[1]);
  auVar11[2] = -(R2S[2] == R1S[2]);
  auVar11[3] = -(R2S[3] == R1S[3]);
  auVar11[4] = -(R2S[4] == R1S[4]);
  auVar11[5] = -(R2S[5] == R1S[5]);
  auVar11[6] = -(R2S[6] == R1S[6]);
  auVar11[7] = -(R2S[7] == R1S[7]);
  auVar11[8] = -(R2S[8] == R1S[8]);
  auVar11[9] = -(R2S[9] == R1S[9]);
  auVar11[10] = -(R2S[10] == R1S[10]);
  auVar11[0xb] = -(R2S[0xb] == R1S[0xb]);
  auVar11[0xc] = -(R2S[0xc] == R1S[0xc]);
  auVar11[0xd] = -(R2S[0xd] == R1S[0xd]);
  auVar11[0xe] = -(R2S[0xe] == R1S[0xe]);
  auVar11[0xf] = -(R2S[0xf] == R1S[0xf]);
  auVar30[0] = -(R2S[0x10] == R1S[0x10]);
  auVar30[1] = -(R2S[0x11] == R1S[0x11]);
  auVar30[2] = -(R2S[0x12] == R1S[0x12]);
  auVar30[3] = -(R2S[0x13] == R1S[0x13]);
  auVar30[4] = 0xff;
  auVar30[5] = 0xff;
  auVar30[6] = 0xff;
  auVar30[7] = 0xff;
  auVar30[8] = 0xff;
  auVar30[9] = 0xff;
  auVar30[10] = 0xff;
  auVar30[0xb] = 0xff;
  auVar30[0xc] = 0xff;
  auVar30[0xd] = 0xff;
  auVar30[0xe] = 0xff;
  auVar30[0xf] = 0xff;
  auVar30 = auVar30 & auVar11;
  bVar8 = (ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = R1S;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)R2S;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e380;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xf48cb4,(size_t)local_98,0x50,
             local_c0,"R2S",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x51;
  file_13.m_begin = (iterator)&local_2f8;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_308,
             msg_13);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  auVar12[0] = -(OneL[0] == ZeroL[0]);
  auVar12[1] = -(OneL[1] == ZeroL[1]);
  auVar12[2] = -(OneL[2] == ZeroL[2]);
  auVar12[3] = -(OneL[3] == ZeroL[3]);
  auVar12[4] = -(OneL[4] == ZeroL[4]);
  auVar12[5] = -(OneL[5] == ZeroL[5]);
  auVar12[6] = -(OneL[6] == ZeroL[6]);
  auVar12[7] = -(OneL[7] == ZeroL[7]);
  auVar12[8] = -(OneL[8] == ZeroL[8]);
  auVar12[9] = -(OneL[9] == ZeroL[9]);
  auVar12[10] = -(OneL[10] == ZeroL[10]);
  auVar12[0xb] = -(OneL[0xb] == ZeroL[0xb]);
  auVar12[0xc] = -(OneL[0xc] == ZeroL[0xc]);
  auVar12[0xd] = -(OneL[0xd] == ZeroL[0xd]);
  auVar12[0xe] = -(OneL[0xe] == ZeroL[0xe]);
  auVar12[0xf] = -(OneL[0xf] == ZeroL[0xf]);
  auVar31[0] = -(OneL[0x10] == ZeroL[0x10]);
  auVar31[1] = -(OneL[0x11] == ZeroL[0x11]);
  auVar31[2] = -(OneL[0x12] == ZeroL[0x12]);
  auVar31[3] = -(OneL[0x13] == ZeroL[0x13]);
  auVar31[4] = -(OneL[0x14] == ZeroL[0x14]);
  auVar31[5] = -(OneL[0x15] == ZeroL[0x15]);
  auVar31[6] = -(OneL[0x16] == ZeroL[0x16]);
  auVar31[7] = -(OneL[0x17] == ZeroL[0x17]);
  auVar31[8] = -(OneL[0x18] == ZeroL[0x18]);
  auVar31[9] = -(OneL[0x19] == ZeroL[0x19]);
  auVar31[10] = -(OneL[0x1a] == ZeroL[0x1a]);
  auVar31[0xb] = -(OneL[0x1b] == ZeroL[0x1b]);
  auVar31[0xc] = -(OneL[0x1c] == ZeroL[0x1c]);
  auVar31[0xd] = -(OneL[0x1d] == ZeroL[0x1d]);
  auVar31[0xe] = -(OneL[0x1e] == ZeroL[0x1e]);
  auVar31[0xf] = -(OneL[0x1f] == ZeroL[0x1f]);
  auVar31 = auVar31 & auVar12;
  bVar8 = (ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = ZeroL;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)OneL;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01389a00;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xe37300,(size_t)local_98,0x51,
             local_c0,"OneL",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x51;
  file_14.m_begin = (iterator)&local_318;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_328,
             msg_14);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  auVar13[0] = -(OneS[0] == ZeroS[0]);
  auVar13[1] = -(OneS[1] == ZeroS[1]);
  auVar13[2] = -(OneS[2] == ZeroS[2]);
  auVar13[3] = -(OneS[3] == ZeroS[3]);
  auVar13[4] = -(OneS[4] == ZeroS[4]);
  auVar13[5] = -(OneS[5] == ZeroS[5]);
  auVar13[6] = -(OneS[6] == ZeroS[6]);
  auVar13[7] = -(OneS[7] == ZeroS[7]);
  auVar13[8] = -(OneS[8] == ZeroS[8]);
  auVar13[9] = -(OneS[9] == ZeroS[9]);
  auVar13[10] = -(OneS[10] == ZeroS[10]);
  auVar13[0xb] = -(OneS[0xb] == ZeroS[0xb]);
  auVar13[0xc] = -(OneS[0xc] == ZeroS[0xc]);
  auVar13[0xd] = -(OneS[0xd] == ZeroS[0xd]);
  auVar13[0xe] = -(OneS[0xe] == ZeroS[0xe]);
  auVar13[0xf] = -(OneS[0xf] == ZeroS[0xf]);
  auVar32[0] = -(OneS[0x10] == ZeroS[0x10]);
  auVar32[1] = -(OneS[0x11] == ZeroS[0x11]);
  auVar32[2] = -(OneS[0x12] == ZeroS[0x12]);
  auVar32[3] = -(OneS[0x13] == ZeroS[0x13]);
  auVar32[4] = 0xff;
  auVar32[5] = 0xff;
  auVar32[6] = 0xff;
  auVar32[7] = 0xff;
  auVar32[8] = 0xff;
  auVar32[9] = 0xff;
  auVar32[10] = 0xff;
  auVar32[0xb] = 0xff;
  auVar32[0xc] = 0xff;
  auVar32[0xd] = 0xff;
  auVar32[0xe] = 0xff;
  auVar32[0xf] = 0xff;
  auVar32 = auVar32 & auVar13;
  bVar8 = (ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = ZeroS;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)OneS;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e380;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xf48cbc,(size_t)local_98,0x51,
             local_c0,"OneS",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x52;
  file_15.m_begin = (iterator)&local_338;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_348,
             msg_15);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  auVar14[0] = -(ZeroL[0] == OneL[0]);
  auVar14[1] = -(ZeroL[1] == OneL[1]);
  auVar14[2] = -(ZeroL[2] == OneL[2]);
  auVar14[3] = -(ZeroL[3] == OneL[3]);
  auVar14[4] = -(ZeroL[4] == OneL[4]);
  auVar14[5] = -(ZeroL[5] == OneL[5]);
  auVar14[6] = -(ZeroL[6] == OneL[6]);
  auVar14[7] = -(ZeroL[7] == OneL[7]);
  auVar14[8] = -(ZeroL[8] == OneL[8]);
  auVar14[9] = -(ZeroL[9] == OneL[9]);
  auVar14[10] = -(ZeroL[10] == OneL[10]);
  auVar14[0xb] = -(ZeroL[0xb] == OneL[0xb]);
  auVar14[0xc] = -(ZeroL[0xc] == OneL[0xc]);
  auVar14[0xd] = -(ZeroL[0xd] == OneL[0xd]);
  auVar14[0xe] = -(ZeroL[0xe] == OneL[0xe]);
  auVar14[0xf] = -(ZeroL[0xf] == OneL[0xf]);
  auVar33[0] = -(ZeroL[0x10] == OneL[0x10]);
  auVar33[1] = -(ZeroL[0x11] == OneL[0x11]);
  auVar33[2] = -(ZeroL[0x12] == OneL[0x12]);
  auVar33[3] = -(ZeroL[0x13] == OneL[0x13]);
  auVar33[4] = -(ZeroL[0x14] == OneL[0x14]);
  auVar33[5] = -(ZeroL[0x15] == OneL[0x15]);
  auVar33[6] = -(ZeroL[0x16] == OneL[0x16]);
  auVar33[7] = -(ZeroL[0x17] == OneL[0x17]);
  auVar33[8] = -(ZeroL[0x18] == OneL[0x18]);
  auVar33[9] = -(ZeroL[0x19] == OneL[0x19]);
  auVar33[10] = -(ZeroL[0x1a] == OneL[0x1a]);
  auVar33[0xb] = -(ZeroL[0x1b] == OneL[0x1b]);
  auVar33[0xc] = -(ZeroL[0x1c] == OneL[0x1c]);
  auVar33[0xd] = -(ZeroL[0x1d] == OneL[0x1d]);
  auVar33[0xe] = -(ZeroL[0x1e] == OneL[0x1e]);
  auVar33[0xf] = -(ZeroL[0x1f] == OneL[0x1f]);
  auVar33 = auVar33 & auVar14;
  bVar8 = (ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = OneL;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)ZeroL;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01389a00;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xe37291,(size_t)local_98,0x52,
             local_c0,"ZeroL",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x52;
  file_16.m_begin = (iterator)&local_358;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_368,
             msg_16);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  auVar15[0] = -(ZeroS[0] == OneS[0]);
  auVar15[1] = -(ZeroS[1] == OneS[1]);
  auVar15[2] = -(ZeroS[2] == OneS[2]);
  auVar15[3] = -(ZeroS[3] == OneS[3]);
  auVar15[4] = -(ZeroS[4] == OneS[4]);
  auVar15[5] = -(ZeroS[5] == OneS[5]);
  auVar15[6] = -(ZeroS[6] == OneS[6]);
  auVar15[7] = -(ZeroS[7] == OneS[7]);
  auVar15[8] = -(ZeroS[8] == OneS[8]);
  auVar15[9] = -(ZeroS[9] == OneS[9]);
  auVar15[10] = -(ZeroS[10] == OneS[10]);
  auVar15[0xb] = -(ZeroS[0xb] == OneS[0xb]);
  auVar15[0xc] = -(ZeroS[0xc] == OneS[0xc]);
  auVar15[0xd] = -(ZeroS[0xd] == OneS[0xd]);
  auVar15[0xe] = -(ZeroS[0xe] == OneS[0xe]);
  auVar15[0xf] = -(ZeroS[0xf] == OneS[0xf]);
  auVar34[0] = -(ZeroS[0x10] == OneS[0x10]);
  auVar34[1] = -(ZeroS[0x11] == OneS[0x11]);
  auVar34[2] = -(ZeroS[0x12] == OneS[0x12]);
  auVar34[3] = -(ZeroS[0x13] == OneS[0x13]);
  auVar34[4] = 0xff;
  auVar34[5] = 0xff;
  auVar34[6] = 0xff;
  auVar34[7] = 0xff;
  auVar34[8] = 0xff;
  auVar34[9] = 0xff;
  auVar34[10] = 0xff;
  auVar34[0xb] = 0xff;
  auVar34[0xc] = 0xff;
  auVar34[0xd] = 0xff;
  auVar34[0xe] = 0xff;
  auVar34[0xf] = 0xff;
  auVar34 = auVar34 & auVar15;
  bVar8 = (ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = OneS;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)ZeroS;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e380;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xf48cc2,(size_t)local_98,0x52,
             local_c0,"ZeroS",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x53;
  file_17.m_begin = (iterator)&local_378;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_388,
             msg_17);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  auVar16[0] = -(ZeroL[0] == MaxL[0]);
  auVar16[1] = -(ZeroL[1] == MaxL[1]);
  auVar16[2] = -(ZeroL[2] == MaxL[2]);
  auVar16[3] = -(ZeroL[3] == MaxL[3]);
  auVar16[4] = -(ZeroL[4] == MaxL[4]);
  auVar16[5] = -(ZeroL[5] == MaxL[5]);
  auVar16[6] = -(ZeroL[6] == MaxL[6]);
  auVar16[7] = -(ZeroL[7] == MaxL[7]);
  auVar16[8] = -(ZeroL[8] == MaxL[8]);
  auVar16[9] = -(ZeroL[9] == MaxL[9]);
  auVar16[10] = -(ZeroL[10] == MaxL[10]);
  auVar16[0xb] = -(ZeroL[0xb] == MaxL[0xb]);
  auVar16[0xc] = -(ZeroL[0xc] == MaxL[0xc]);
  auVar16[0xd] = -(ZeroL[0xd] == MaxL[0xd]);
  auVar16[0xe] = -(ZeroL[0xe] == MaxL[0xe]);
  auVar16[0xf] = -(ZeroL[0xf] == MaxL[0xf]);
  auVar35[0] = -(ZeroL[0x10] == MaxL[0x10]);
  auVar35[1] = -(ZeroL[0x11] == MaxL[0x11]);
  auVar35[2] = -(ZeroL[0x12] == MaxL[0x12]);
  auVar35[3] = -(ZeroL[0x13] == MaxL[0x13]);
  auVar35[4] = -(ZeroL[0x14] == MaxL[0x14]);
  auVar35[5] = -(ZeroL[0x15] == MaxL[0x15]);
  auVar35[6] = -(ZeroL[0x16] == MaxL[0x16]);
  auVar35[7] = -(ZeroL[0x17] == MaxL[0x17]);
  auVar35[8] = -(ZeroL[0x18] == MaxL[0x18]);
  auVar35[9] = -(ZeroL[0x19] == MaxL[0x19]);
  auVar35[10] = -(ZeroL[0x1a] == MaxL[0x1a]);
  auVar35[0xb] = -(ZeroL[0x1b] == MaxL[0x1b]);
  auVar35[0xc] = -(ZeroL[0x1c] == MaxL[0x1c]);
  auVar35[0xd] = -(ZeroL[0x1d] == MaxL[0x1d]);
  auVar35[0xe] = -(ZeroL[0x1e] == MaxL[0x1e]);
  auVar35[0xf] = -(ZeroL[0x1f] == MaxL[0x1f]);
  auVar35 = auVar35 & auVar16;
  bVar8 = (ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = MaxL;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)ZeroL;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01389a00;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xe37860,(size_t)local_98,0x53,
             local_c0,"ZeroL",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x53;
  file_18.m_begin = (iterator)&local_398;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_3a8,
             msg_18);
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (string **)0xf4aea1;
  auVar17[0] = -(ZeroS[0] == MaxS[0]);
  auVar17[1] = -(ZeroS[1] == MaxS[1]);
  auVar17[2] = -(ZeroS[2] == MaxS[2]);
  auVar17[3] = -(ZeroS[3] == MaxS[3]);
  auVar17[4] = -(ZeroS[4] == MaxS[4]);
  auVar17[5] = -(ZeroS[5] == MaxS[5]);
  auVar17[6] = -(ZeroS[6] == MaxS[6]);
  auVar17[7] = -(ZeroS[7] == MaxS[7]);
  auVar17[8] = -(ZeroS[8] == MaxS[8]);
  auVar17[9] = -(ZeroS[9] == MaxS[9]);
  auVar17[10] = -(ZeroS[10] == MaxS[10]);
  auVar17[0xb] = -(ZeroS[0xb] == MaxS[0xb]);
  auVar17[0xc] = -(ZeroS[0xc] == MaxS[0xc]);
  auVar17[0xd] = -(ZeroS[0xd] == MaxS[0xd]);
  auVar17[0xe] = -(ZeroS[0xe] == MaxS[0xe]);
  auVar17[0xf] = -(ZeroS[0xf] == MaxS[0xf]);
  auVar36[0] = -(ZeroS[0x10] == MaxS[0x10]);
  auVar36[1] = -(ZeroS[0x11] == MaxS[0x11]);
  auVar36[2] = -(ZeroS[0x12] == MaxS[0x12]);
  auVar36[3] = -(ZeroS[0x13] == MaxS[0x13]);
  auVar36[4] = 0xff;
  auVar36[5] = 0xff;
  auVar36[6] = 0xff;
  auVar36[7] = 0xff;
  auVar36[8] = 0xff;
  auVar36[9] = 0xff;
  auVar36[10] = 0xff;
  auVar36[0xb] = 0xff;
  auVar36[0xc] = 0xff;
  auVar36[0xd] = 0xff;
  auVar36[0xe] = 0xff;
  auVar36[0xf] = 0xff;
  auVar36 = auVar36 & auVar17;
  bVar8 = (ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) == 0xffff;
  local_c0[0] = bVar8;
  stack0xffffffffffffff48 = (undefined1  [16])0x0;
  local_78[0] = (class_property<bool>)(class_property<bool>)!bVar8;
  local_78._8_8_ = (element_type *)0x0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_b0._M_allocated_capacity);
  local_98._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  stack0xffffffffffffff70 = (element_type *)0xf48bcd;
  local_50._0_8_ = MaxS;
  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
  local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_b0._8_8_ = local_50;
  local_f8 = (string *)ZeroS;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0138e380;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_f8;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_78,&local_120,1,3,REQUIRE,0xf48cc7,(size_t)local_98,0x53,
             local_c0,"ZeroS",&local_e0);
  boost::detail::shared_count::~shared_count(&sStack_68);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_3b0 = "";
  ppuVar4 = &local_3c8;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x56;
  file_19.m_begin = (iterator)&local_3b8;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)ppuVar4,msg_19);
  local_78._8_8_ = local_78._9_8_ << 8;
  local_78._0_8_ = &PTR__lazy_ostream_01388f08;
  sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_98,&R1L);
  str._M_str = (char *)ppuVar4;
  str._M_len = local_98._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_c0,(detail *)stack0xffffffffffffff70,str);
  if (local_a0 == '\0') {
    if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    auVar18[0] = -(local_c0[0] == R1L);
    auVar18[1] = -(local_c0[1] == cRam00000000013a249a);
    auVar18[2] = -(local_c0[2] == cRam00000000013a249b);
    auVar18[3] = -(local_c0[3] == cRam00000000013a249c);
    auVar18[4] = -(local_c0[4] == cRam00000000013a249d);
    auVar18[5] = -(local_c0[5] == cRam00000000013a249e);
    auVar18[6] = -(local_c0[6] == cRam00000000013a249f);
    auVar18[7] = -(local_c0[7] == cRam00000000013a24a0);
    auVar18[8] = -(local_c0[8] == cRam00000000013a24a1);
    auVar18[9] = -(auStack_b7[0] == cRam00000000013a24a2);
    auVar18[10] = -(auStack_b7[1] == cRam00000000013a24a3);
    auVar18[0xb] = -(auStack_b7[2] == cRam00000000013a24a4);
    auVar18[0xc] = -(auStack_b7[3] == cRam00000000013a24a5);
    auVar18[0xd] = -(auStack_b7[4] == cRam00000000013a24a6);
    auVar18[0xe] = -(auStack_b7[5] == cRam00000000013a24a7);
    auVar18[0xf] = -(auStack_b7[6] == cRam00000000013a24a8);
    auVar37[0] = -(DAT_013a24a9 == aStack_b0._M_local_buf[0]);
    auVar37[1] = -(cRam00000000013a24aa == aStack_b0._M_local_buf[1]);
    auVar37[2] = -(cRam00000000013a24ab == aStack_b0._M_local_buf[2]);
    auVar37[3] = -(cRam00000000013a24ac == aStack_b0._M_local_buf[3]);
    auVar37[4] = -(cRam00000000013a24ad == aStack_b0._M_local_buf[4]);
    auVar37[5] = -(cRam00000000013a24ae == aStack_b0._M_local_buf[5]);
    auVar37[6] = -(cRam00000000013a24af == aStack_b0._M_local_buf[6]);
    auVar37[7] = -(cRam00000000013a24b0 == aStack_b0._M_local_buf[7]);
    auVar37[8] = -(cRam00000000013a24b1 == aStack_b0._M_local_buf[8]);
    auVar37[9] = -(cRam00000000013a24b2 == aStack_b0._M_local_buf[9]);
    auVar37[10] = -(cRam00000000013a24b3 == aStack_b0._M_local_buf[10]);
    auVar37[0xb] = -(cRam00000000013a24b4 == aStack_b0._M_local_buf[0xb]);
    auVar37[0xc] = -(cRam00000000013a24b5 == aStack_b0._M_local_buf[0xc]);
    auVar37[0xd] = -(cRam00000000013a24b6 == aStack_b0._M_local_buf[0xd]);
    auVar37[0xe] = -(cRam00000000013a24b7 == aStack_b0._M_local_buf[0xe]);
    auVar37[0xf] = -(DAT_013a24b8 == aStack_b0._M_local_buf[0xf]);
    auVar37 = auVar37 & auVar18;
    local_50[0] = (readonly_property<bool>)
                  (readonly_property<bool>)
                  ((ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar37[0xf] >> 7) << 0xf) == 0xffff);
    stack0xffffffffffffffb8 = (element_type *)0x0;
    asStack_40[0].pi_ = (sp_counted_base *)0x0;
    local_f8 = (string *)0xf48b67;
    local_f0 = "";
    local_d8 = 0;
    local_e0 = &PTR__lazy_ostream_01389a00;
    local_d0 = boost::unit_test::lazy_ostream::inst;
    local_c8 = &local_e8;
    local_100 = (string *)&R1L;
    local_120.m_empty = false;
    local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
    local_110 = boost::unit_test::lazy_ostream::inst;
    local_108 = &local_100;
    pvVar5 = (iterator)0x1;
    pvVar6 = (iterator)0x2;
    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_50,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48ccc,
               (size_t)&local_f8,0x56,&local_e0,"R1L",&local_120);
    boost::detail::shared_count::~shared_count(asStack_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &aStack_88) {
      operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
    }
    local_3d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3d0 = "";
    ppuVar4 = &local_3e8;
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_20.m_end = (iterator)0x57;
    file_20.m_begin = (iterator)&local_3d8;
    msg_20.m_end = pvVar6;
    msg_20.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)ppuVar4,msg_20
              );
    local_78._8_8_ = local_78._9_8_ << 8;
    local_78._0_8_ = &PTR__lazy_ostream_01388f08;
    sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
    base_blob<256u>::ToString_abi_cxx11_((string *)local_98,&R2L);
    str_00._M_str = (char *)ppuVar4;
    str_00._M_len = local_98._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_c0,(detail *)stack0xffffffffffffff70,str_00)
    ;
    if (local_a0 == '\0') {
      if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      auVar19[0] = -(local_c0[0] == R2L);
      auVar19[1] = -(local_c0[1] == cRam00000000013a24ce);
      auVar19[2] = -(local_c0[2] == cRam00000000013a24cf);
      auVar19[3] = -(local_c0[3] == cRam00000000013a24d0);
      auVar19[4] = -(local_c0[4] == cRam00000000013a24d1);
      auVar19[5] = -(local_c0[5] == cRam00000000013a24d2);
      auVar19[6] = -(local_c0[6] == cRam00000000013a24d3);
      auVar19[7] = -(local_c0[7] == cRam00000000013a24d4);
      auVar19[8] = -(local_c0[8] == cRam00000000013a24d5);
      auVar19[9] = -(auStack_b7[0] == cRam00000000013a24d6);
      auVar19[10] = -(auStack_b7[1] == cRam00000000013a24d7);
      auVar19[0xb] = -(auStack_b7[2] == cRam00000000013a24d8);
      auVar19[0xc] = -(auStack_b7[3] == cRam00000000013a24d9);
      auVar19[0xd] = -(auStack_b7[4] == cRam00000000013a24da);
      auVar19[0xe] = -(auStack_b7[5] == cRam00000000013a24db);
      auVar19[0xf] = -(auStack_b7[6] == cRam00000000013a24dc);
      auVar38[0] = -(DAT_013a24dd == aStack_b0._M_local_buf[0]);
      auVar38[1] = -(cRam00000000013a24de == aStack_b0._M_local_buf[1]);
      auVar38[2] = -(cRam00000000013a24df == aStack_b0._M_local_buf[2]);
      auVar38[3] = -(cRam00000000013a24e0 == aStack_b0._M_local_buf[3]);
      auVar38[4] = -(cRam00000000013a24e1 == aStack_b0._M_local_buf[4]);
      auVar38[5] = -(cRam00000000013a24e2 == aStack_b0._M_local_buf[5]);
      auVar38[6] = -(cRam00000000013a24e3 == aStack_b0._M_local_buf[6]);
      auVar38[7] = -(cRam00000000013a24e4 == aStack_b0._M_local_buf[7]);
      auVar38[8] = -(cRam00000000013a24e5 == aStack_b0._M_local_buf[8]);
      auVar38[9] = -(cRam00000000013a24e6 == aStack_b0._M_local_buf[9]);
      auVar38[10] = -(cRam00000000013a24e7 == aStack_b0._M_local_buf[10]);
      auVar38[0xb] = -(cRam00000000013a24e8 == aStack_b0._M_local_buf[0xb]);
      auVar38[0xc] = -(cRam00000000013a24e9 == aStack_b0._M_local_buf[0xc]);
      auVar38[0xd] = -(cRam00000000013a24ea == aStack_b0._M_local_buf[0xd]);
      auVar38[0xe] = -(cRam00000000013a24eb == aStack_b0._M_local_buf[0xe]);
      auVar38[0xf] = -(DAT_013a24ec == aStack_b0._M_local_buf[0xf]);
      auVar38 = auVar38 & auVar19;
      local_50[0] = (readonly_property<bool>)
                    (readonly_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) == 0xffff);
      stack0xffffffffffffffb8 = (element_type *)0x0;
      asStack_40[0].pi_ = (sp_counted_base *)0x0;
      local_f8 = (string *)0xf48b67;
      local_f0 = "";
      local_d8 = 0;
      local_e0 = &PTR__lazy_ostream_01389a00;
      local_d0 = boost::unit_test::lazy_ostream::inst;
      local_c8 = &local_e8;
      local_100 = (string *)&R2L;
      local_120.m_empty = false;
      local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
      local_110 = boost::unit_test::lazy_ostream::inst;
      local_108 = &local_100;
      pvVar5 = (iterator)0x1;
      pvVar6 = (iterator)0x2;
      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_50,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48cf5,
                 (size_t)&local_f8,0x57,&local_e0,"R2L",&local_120);
      boost::detail::shared_count::~shared_count(asStack_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._0_8_ != &aStack_88) {
        operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
      }
      local_3f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_3f0 = "";
      ppuVar4 = &local_408;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      local_400 = &boost::unit_test::basic_cstring<char_const>::null;
      file_21.m_end = &DAT_00000058;
      file_21.m_begin = (iterator)&local_3f8;
      msg_21.m_end = pvVar6;
      msg_21.m_begin = pvVar5;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)ppuVar4,
                 msg_21);
      local_78._8_8_ = local_78._9_8_ << 8;
      local_78._0_8_ = &PTR__lazy_ostream_01388f08;
      sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
      base_blob<256u>::ToString_abi_cxx11_((string *)local_98,ZeroL);
      str_01._M_str = (char *)ppuVar4;
      str_01._M_len = local_98._0_8_;
      detail::FromHex<uint256>
                ((optional<uint256> *)local_c0,(detail *)stack0xffffffffffffff70,str_01);
      if (local_a0 == '\0') {
        if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        auVar20[0] = -(local_c0[0] == ZeroL[0]);
        auVar20[1] = -(local_c0[1] == ZeroL[1]);
        auVar20[2] = -(local_c0[2] == ZeroL[2]);
        auVar20[3] = -(local_c0[3] == ZeroL[3]);
        auVar20[4] = -(local_c0[4] == ZeroL[4]);
        auVar20[5] = -(local_c0[5] == ZeroL[5]);
        auVar20[6] = -(local_c0[6] == ZeroL[6]);
        auVar20[7] = -(local_c0[7] == ZeroL[7]);
        auVar20[8] = -(local_c0[8] == ZeroL[8]);
        auVar20[9] = -(auStack_b7[0] == ZeroL[9]);
        auVar20[10] = -(auStack_b7[1] == ZeroL[10]);
        auVar20[0xb] = -(auStack_b7[2] == ZeroL[0xb]);
        auVar20[0xc] = -(auStack_b7[3] == ZeroL[0xc]);
        auVar20[0xd] = -(auStack_b7[4] == ZeroL[0xd]);
        auVar20[0xe] = -(auStack_b7[5] == ZeroL[0xe]);
        auVar20[0xf] = -(auStack_b7[6] == ZeroL[0xf]);
        auVar39[0] = -(ZeroL[0x10] == aStack_b0._M_local_buf[0]);
        auVar39[1] = -(ZeroL[0x11] == aStack_b0._M_local_buf[1]);
        auVar39[2] = -(ZeroL[0x12] == aStack_b0._M_local_buf[2]);
        auVar39[3] = -(ZeroL[0x13] == aStack_b0._M_local_buf[3]);
        auVar39[4] = -(ZeroL[0x14] == aStack_b0._M_local_buf[4]);
        auVar39[5] = -(ZeroL[0x15] == aStack_b0._M_local_buf[5]);
        auVar39[6] = -(ZeroL[0x16] == aStack_b0._M_local_buf[6]);
        auVar39[7] = -(ZeroL[0x17] == aStack_b0._M_local_buf[7]);
        auVar39[8] = -(ZeroL[0x18] == aStack_b0._M_local_buf[8]);
        auVar39[9] = -(ZeroL[0x19] == aStack_b0._M_local_buf[9]);
        auVar39[10] = -(ZeroL[0x1a] == aStack_b0._M_local_buf[10]);
        auVar39[0xb] = -(ZeroL[0x1b] == aStack_b0._M_local_buf[0xb]);
        auVar39[0xc] = -(ZeroL[0x1c] == aStack_b0._M_local_buf[0xc]);
        auVar39[0xd] = -(ZeroL[0x1d] == aStack_b0._M_local_buf[0xd]);
        auVar39[0xe] = -(ZeroL[0x1e] == aStack_b0._M_local_buf[0xe]);
        auVar39[0xf] = -(ZeroL[0x1f] == aStack_b0._M_local_buf[0xf]);
        auVar39 = auVar39 & auVar20;
        local_50[0] = (readonly_property<bool>)
                      (readonly_property<bool>)
                      ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                               (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) == 0xffff);
        stack0xffffffffffffffb8 = (element_type *)0x0;
        asStack_40[0].pi_ = (sp_counted_base *)0x0;
        local_f8 = (string *)0xf48b67;
        local_f0 = "";
        local_d8 = 0;
        local_e0 = &PTR__lazy_ostream_01389a00;
        local_d0 = boost::unit_test::lazy_ostream::inst;
        local_c8 = &local_e8;
        local_100 = (string *)ZeroL;
        local_120.m_empty = false;
        local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
        local_110 = boost::unit_test::lazy_ostream::inst;
        local_108 = &local_100;
        pvVar5 = (iterator)0x1;
        pvVar6 = (iterator)0x2;
        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_50,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48d1e,
                   (size_t)&local_f8,0x58,&local_e0,"ZeroL",&local_120);
        boost::detail::shared_count::~shared_count(asStack_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._0_8_ != &aStack_88) {
          operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
        }
        local_418 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
        ;
        local_410 = "";
        ppuVar4 = &local_428;
        local_428 = &boost::unit_test::basic_cstring<char_const>::null;
        local_420 = &boost::unit_test::basic_cstring<char_const>::null;
        file_22.m_end = (iterator)0x59;
        file_22.m_begin = (iterator)&local_418;
        msg_22.m_end = pvVar6;
        msg_22.m_begin = pvVar5;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)ppuVar4,
                   msg_22);
        local_78._8_8_ = local_78._9_8_ << 8;
        local_78._0_8_ = &PTR__lazy_ostream_01388f08;
        sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
        base_blob<256u>::ToString_abi_cxx11_((string *)local_98,OneL);
        str_02._M_str = (char *)ppuVar4;
        str_02._M_len = local_98._0_8_;
        detail::FromHex<uint256>
                  ((optional<uint256> *)local_c0,(detail *)stack0xffffffffffffff70,str_02);
        if (local_a0 == '\0') {
          if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          auVar21[0] = -(local_c0[0] == OneL[0]);
          auVar21[1] = -(local_c0[1] == OneL[1]);
          auVar21[2] = -(local_c0[2] == OneL[2]);
          auVar21[3] = -(local_c0[3] == OneL[3]);
          auVar21[4] = -(local_c0[4] == OneL[4]);
          auVar21[5] = -(local_c0[5] == OneL[5]);
          auVar21[6] = -(local_c0[6] == OneL[6]);
          auVar21[7] = -(local_c0[7] == OneL[7]);
          auVar21[8] = -(local_c0[8] == OneL[8]);
          auVar21[9] = -(auStack_b7[0] == OneL[9]);
          auVar21[10] = -(auStack_b7[1] == OneL[10]);
          auVar21[0xb] = -(auStack_b7[2] == OneL[0xb]);
          auVar21[0xc] = -(auStack_b7[3] == OneL[0xc]);
          auVar21[0xd] = -(auStack_b7[4] == OneL[0xd]);
          auVar21[0xe] = -(auStack_b7[5] == OneL[0xe]);
          auVar21[0xf] = -(auStack_b7[6] == OneL[0xf]);
          auVar40[0] = -(OneL[0x10] == aStack_b0._M_local_buf[0]);
          auVar40[1] = -(OneL[0x11] == aStack_b0._M_local_buf[1]);
          auVar40[2] = -(OneL[0x12] == aStack_b0._M_local_buf[2]);
          auVar40[3] = -(OneL[0x13] == aStack_b0._M_local_buf[3]);
          auVar40[4] = -(OneL[0x14] == aStack_b0._M_local_buf[4]);
          auVar40[5] = -(OneL[0x15] == aStack_b0._M_local_buf[5]);
          auVar40[6] = -(OneL[0x16] == aStack_b0._M_local_buf[6]);
          auVar40[7] = -(OneL[0x17] == aStack_b0._M_local_buf[7]);
          auVar40[8] = -(OneL[0x18] == aStack_b0._M_local_buf[8]);
          auVar40[9] = -(OneL[0x19] == aStack_b0._M_local_buf[9]);
          auVar40[10] = -(OneL[0x1a] == aStack_b0._M_local_buf[10]);
          auVar40[0xb] = -(OneL[0x1b] == aStack_b0._M_local_buf[0xb]);
          auVar40[0xc] = -(OneL[0x1c] == aStack_b0._M_local_buf[0xc]);
          auVar40[0xd] = -(OneL[0x1d] == aStack_b0._M_local_buf[0xd]);
          auVar40[0xe] = -(OneL[0x1e] == aStack_b0._M_local_buf[0xe]);
          auVar40[0xf] = -(OneL[0x1f] == aStack_b0._M_local_buf[0xf]);
          auVar40 = auVar40 & auVar21;
          local_50[0] = (readonly_property<bool>)
                        (readonly_property<bool>)
                        ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                                 (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) == 0xffff);
          stack0xffffffffffffffb8 = (element_type *)0x0;
          asStack_40[0].pi_ = (sp_counted_base *)0x0;
          local_f8 = (string *)0xf48b67;
          local_f0 = "";
          local_d8 = 0;
          local_e0 = &PTR__lazy_ostream_01389a00;
          local_d0 = boost::unit_test::lazy_ostream::inst;
          local_c8 = &local_e8;
          local_100 = (string *)OneL;
          local_120.m_empty = false;
          local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
          local_110 = boost::unit_test::lazy_ostream::inst;
          local_108 = &local_100;
          pvVar5 = (iterator)0x1;
          pvVar6 = (iterator)0x2;
          local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_50,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48d49,
                     (size_t)&local_f8,0x59,&local_e0,"OneL",&local_120);
          boost::detail::shared_count::~shared_count(asStack_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._0_8_ != &aStack_88) {
            operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
          }
          local_438 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
          ;
          local_430 = "";
          ppuVar4 = &local_448;
          local_448 = &boost::unit_test::basic_cstring<char_const>::null;
          local_440 = &boost::unit_test::basic_cstring<char_const>::null;
          file_23.m_end = (iterator)0x5a;
          file_23.m_begin = (iterator)&local_438;
          msg_23.m_end = pvVar6;
          msg_23.m_begin = pvVar5;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)ppuVar4,
                     msg_23);
          local_78._8_8_ = local_78._9_8_ << 8;
          local_78._0_8_ = &PTR__lazy_ostream_01388f08;
          sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
          uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
          base_blob<256u>::ToString_abi_cxx11_((string *)local_98,MaxL);
          str_03._M_str = (char *)ppuVar4;
          str_03._M_len = local_98._0_8_;
          detail::FromHex<uint256>
                    ((optional<uint256> *)local_c0,(detail *)stack0xffffffffffffff70,str_03);
          if (local_a0 == '\0') {
            if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            auVar22[0] = -(local_c0[0] == MaxL[0]);
            auVar22[1] = -(local_c0[1] == MaxL[1]);
            auVar22[2] = -(local_c0[2] == MaxL[2]);
            auVar22[3] = -(local_c0[3] == MaxL[3]);
            auVar22[4] = -(local_c0[4] == MaxL[4]);
            auVar22[5] = -(local_c0[5] == MaxL[5]);
            auVar22[6] = -(local_c0[6] == MaxL[6]);
            auVar22[7] = -(local_c0[7] == MaxL[7]);
            auVar22[8] = -(local_c0[8] == MaxL[8]);
            auVar22[9] = -(auStack_b7[0] == MaxL[9]);
            auVar22[10] = -(auStack_b7[1] == MaxL[10]);
            auVar22[0xb] = -(auStack_b7[2] == MaxL[0xb]);
            auVar22[0xc] = -(auStack_b7[3] == MaxL[0xc]);
            auVar22[0xd] = -(auStack_b7[4] == MaxL[0xd]);
            auVar22[0xe] = -(auStack_b7[5] == MaxL[0xe]);
            auVar22[0xf] = -(auStack_b7[6] == MaxL[0xf]);
            auVar41[0] = -(MaxL[0x10] == aStack_b0._M_local_buf[0]);
            auVar41[1] = -(MaxL[0x11] == aStack_b0._M_local_buf[1]);
            auVar41[2] = -(MaxL[0x12] == aStack_b0._M_local_buf[2]);
            auVar41[3] = -(MaxL[0x13] == aStack_b0._M_local_buf[3]);
            auVar41[4] = -(MaxL[0x14] == aStack_b0._M_local_buf[4]);
            auVar41[5] = -(MaxL[0x15] == aStack_b0._M_local_buf[5]);
            auVar41[6] = -(MaxL[0x16] == aStack_b0._M_local_buf[6]);
            auVar41[7] = -(MaxL[0x17] == aStack_b0._M_local_buf[7]);
            auVar41[8] = -(MaxL[0x18] == aStack_b0._M_local_buf[8]);
            auVar41[9] = -(MaxL[0x19] == aStack_b0._M_local_buf[9]);
            auVar41[10] = -(MaxL[0x1a] == aStack_b0._M_local_buf[10]);
            auVar41[0xb] = -(MaxL[0x1b] == aStack_b0._M_local_buf[0xb]);
            auVar41[0xc] = -(MaxL[0x1c] == aStack_b0._M_local_buf[0xc]);
            auVar41[0xd] = -(MaxL[0x1d] == aStack_b0._M_local_buf[0xd]);
            auVar41[0xe] = -(MaxL[0x1e] == aStack_b0._M_local_buf[0xe]);
            auVar41[0xf] = -(MaxL[0x1f] == aStack_b0._M_local_buf[0xf]);
            auVar41 = auVar41 & auVar22;
            local_50[0] = (readonly_property<bool>)
                          (readonly_property<bool>)
                          ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) == 0xffff);
            stack0xffffffffffffffb8 = (element_type *)0x0;
            asStack_40[0].pi_ = (sp_counted_base *)0x0;
            local_f8 = (string *)0xf48b67;
            local_f0 = "";
            local_d8 = 0;
            local_e0 = &PTR__lazy_ostream_01389a00;
            local_d0 = boost::unit_test::lazy_ostream::inst;
            local_c8 = &local_e8;
            local_100 = (string *)MaxL;
            local_120.m_empty = false;
            local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
            local_110 = boost::unit_test::lazy_ostream::inst;
            local_108 = &local_100;
            pvVar5 = (iterator)0x1;
            pvVar6 = (iterator)0x2;
            local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
            ;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_50,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48d73,
                       (size_t)&local_f8,0x5a,&local_e0,"MaxL",&local_120);
            boost::detail::shared_count::~shared_count(asStack_40);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._0_8_ != &aStack_88) {
              operator_delete((void *)local_98._0_8_,aStack_88._M_allocated_capacity + 1);
            }
            local_458 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
            ;
            local_450 = "";
            ppuVar4 = &local_468;
            local_468 = &boost::unit_test::basic_cstring<char_const>::null;
            local_460 = &boost::unit_test::basic_cstring<char_const>::null;
            file_24.m_end = (iterator)0x5b;
            file_24.m_begin = (iterator)&local_458;
            msg_24.m_end = pvVar6;
            msg_24.m_begin = pvVar5;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                       (size_t)ppuVar4,msg_24);
            local_78._8_8_ = local_78._9_8_ << 8;
            local_78._0_8_ = &PTR__lazy_ostream_01388f08;
            sStack_68.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            uStack_60 = (long)"\x05\x04\x03\x02\x01" + 5;
            str_04._M_str = (char *)ppuVar4;
            str_04._M_len = (size_t)R1ArrayHex;
            detail::FromHex<uint256>((optional<uint256> *)local_c0,(detail *)0x40,str_04);
            if (local_a0 == '\0') {
              if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              auVar23[0] = -(local_c0[0] == R1L);
              auVar23[1] = -(local_c0[1] == cRam00000000013a249a);
              auVar23[2] = -(local_c0[2] == cRam00000000013a249b);
              auVar23[3] = -(local_c0[3] == cRam00000000013a249c);
              auVar23[4] = -(local_c0[4] == cRam00000000013a249d);
              auVar23[5] = -(local_c0[5] == cRam00000000013a249e);
              auVar23[6] = -(local_c0[6] == cRam00000000013a249f);
              auVar23[7] = -(local_c0[7] == cRam00000000013a24a0);
              auVar23[8] = -(local_c0[8] == cRam00000000013a24a1);
              auVar23[9] = -(auStack_b7[0] == cRam00000000013a24a2);
              auVar23[10] = -(auStack_b7[1] == cRam00000000013a24a3);
              auVar23[0xb] = -(auStack_b7[2] == cRam00000000013a24a4);
              auVar23[0xc] = -(auStack_b7[3] == cRam00000000013a24a5);
              auVar23[0xd] = -(auStack_b7[4] == cRam00000000013a24a6);
              auVar23[0xe] = -(auStack_b7[5] == cRam00000000013a24a7);
              auVar23[0xf] = -(auStack_b7[6] == cRam00000000013a24a8);
              auVar42[0] = -(DAT_013a24a9 == aStack_b0._M_local_buf[0]);
              auVar42[1] = -(cRam00000000013a24aa == aStack_b0._M_local_buf[1]);
              auVar42[2] = -(cRam00000000013a24ab == aStack_b0._M_local_buf[2]);
              auVar42[3] = -(cRam00000000013a24ac == aStack_b0._M_local_buf[3]);
              auVar42[4] = -(cRam00000000013a24ad == aStack_b0._M_local_buf[4]);
              auVar42[5] = -(cRam00000000013a24ae == aStack_b0._M_local_buf[5]);
              auVar42[6] = -(cRam00000000013a24af == aStack_b0._M_local_buf[6]);
              auVar42[7] = -(cRam00000000013a24b0 == aStack_b0._M_local_buf[7]);
              auVar42[8] = -(cRam00000000013a24b1 == aStack_b0._M_local_buf[8]);
              auVar42[9] = -(cRam00000000013a24b2 == aStack_b0._M_local_buf[9]);
              auVar42[10] = -(cRam00000000013a24b3 == aStack_b0._M_local_buf[10]);
              auVar42[0xb] = -(cRam00000000013a24b4 == aStack_b0._M_local_buf[0xb]);
              auVar42[0xc] = -(cRam00000000013a24b5 == aStack_b0._M_local_buf[0xc]);
              auVar42[0xd] = -(cRam00000000013a24b6 == aStack_b0._M_local_buf[0xd]);
              auVar42[0xe] = -(cRam00000000013a24b7 == aStack_b0._M_local_buf[0xe]);
              auVar42[0xf] = -(DAT_013a24b8 == aStack_b0._M_local_buf[0xf]);
              auVar42 = auVar42 & auVar23;
              stack0xffffffffffffff70 = (element_type *)0x0;
              aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_50._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
              local_d8 = 0;
              local_e0 = &PTR__lazy_ostream_01389a00;
              local_d0 = boost::unit_test::lazy_ostream::inst;
              local_e8 = (string *)&R1L;
              local_120.m_empty = false;
              local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389a00;
              local_110 = boost::unit_test::lazy_ostream::inst;
              local_108 = &local_e8;
              pvVar5 = (iterator)0x1;
              pvVar6 = (iterator)0x2;
              local_f8 = (string *)local_c0;
              local_c8 = &local_f8;
              local_98[0] = (class_property<bool>)
                            (class_property<bool>)
                            ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) == 0xffff);
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_98,(lazy_ostream *)local_78,1,2,REQUIRE,0xf48d9d,
                         (size_t)local_50,0x5b,&local_e0,"R1L",&local_120);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_88._M_allocated_capacity);
              local_478 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_470 = "";
              local_488 = &boost::unit_test::basic_cstring<char_const>::null;
              local_480 = &boost::unit_test::basic_cstring<char_const>::null;
              file_25.m_end = (iterator)0x5c;
              file_25.m_begin = (iterator)&local_478;
              msg_25.m_end = pvVar6;
              msg_25.m_begin = pvVar5;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                         (size_t)&local_488,msg_25);
              local_120.m_empty = false;
              local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
              local_110 = boost::unit_test::lazy_ostream::inst;
              local_108 = (string **)0xf4aea1;
              sStack_68.pi_._1_1_ = cRam00000000013a24aa;
              sStack_68.pi_._0_1_ = DAT_013a24a9;
              sStack_68.pi_._2_1_ = cRam00000000013a24ab;
              sStack_68.pi_._3_1_ = cRam00000000013a24ac;
              sStack_68.pi_._4_1_ = cRam00000000013a24ad;
              sStack_68.pi_._5_1_ = cRam00000000013a24ae;
              sStack_68.pi_._6_1_ = cRam00000000013a24af;
              sStack_68.pi_._7_1_ = cRam00000000013a24b0;
              uStack_60 = CONCAT17(DAT_013a24b8,
                                   CONCAT16(cRam00000000013a24b7,
                                            CONCAT15(cRam00000000013a24b6,
                                                     CONCAT14(cRam00000000013a24b5,
                                                              CONCAT13(cRam00000000013a24b4,
                                                                       CONCAT12(cRam00000000013a24b3
                                                                                ,CONCAT11(
                                                  cRam00000000013a24b2,cRam00000000013a24b1)))))));
              local_78._0_8_ =
                   CONCAT17(cRam00000000013a24a0,
                            CONCAT16(cRam00000000013a249f,
                                     CONCAT15(cRam00000000013a249e,
                                              CONCAT14(cRam00000000013a249d,
                                                       CONCAT13(cRam00000000013a249c,
                                                                CONCAT12(cRam00000000013a249b,
                                                                         CONCAT11(
                                                  cRam00000000013a249a,R1L)))))));
              local_78[9] = cRam00000000013a24a2;
              local_78[8] = cRam00000000013a24a1;
              local_78[10] = cRam00000000013a24a3;
              local_78[0xb] = cRam00000000013a24a4;
              local_78[0xc] = cRam00000000013a24a5;
              local_78[0xd] = cRam00000000013a24a6;
              local_78[0xe] = cRam00000000013a24a7;
              local_78[0xf] = cRam00000000013a24a8;
              local_98[0] = (class_property<bool>)0x1;
              stack0xffffffffffffff70 = (element_type *)0x0;
              aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_50._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
              local_f8 = (string *)local_78;
              stack0xffffffffffffff48 = local_c0._9_8_ << 8;
              local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
              aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              aStack_b0._8_8_ = &local_f8;
              local_e8 = (string *)&R1L;
              local_d8 = 0;
              local_e0 = &PTR__lazy_ostream_01389a00;
              local_d0 = boost::unit_test::lazy_ostream::inst;
              local_c8 = &local_e8;
              pvVar5 = (iterator)0x1;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48dc2,
                         (size_t)local_50,0x5c,local_c0,"R1L",&local_e0);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_88._M_allocated_capacity);
              local_498 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_490 = "";
              local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_26.m_end = (iterator)0x5d;
              file_26.m_begin = (iterator)&local_498;
              msg_26.m_end = pvVar6;
              msg_26.m_begin = pvVar5;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                         (size_t)&local_4a8,msg_26);
              local_120.m_empty = false;
              local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
              local_110 = boost::unit_test::lazy_ostream::inst;
              local_108 = (string **)0xf4aea1;
              sStack_68.pi_._1_1_ = ZeroL[0x11];
              sStack_68.pi_._0_1_ = ZeroL[0x10];
              sStack_68.pi_._2_1_ = ZeroL[0x12];
              sStack_68.pi_._3_1_ = ZeroL[0x13];
              sStack_68.pi_._4_1_ = ZeroL[0x14];
              sStack_68.pi_._5_1_ = ZeroL[0x15];
              sStack_68.pi_._6_1_ = ZeroL[0x16];
              sStack_68.pi_._7_1_ = ZeroL[0x17];
              uStack_60 = CONCAT17(ZeroL[0x1f],
                                   CONCAT16(ZeroL[0x1e],
                                            CONCAT15(ZeroL[0x1d],
                                                     CONCAT14(ZeroL[0x1c],
                                                              CONCAT13(ZeroL[0x1b],
                                                                       CONCAT12(ZeroL[0x1a],
                                                                                CONCAT11(ZeroL[0x19]
                                                                                         ,ZeroL[0x18
                                                  ])))))));
              local_78._0_8_ =
                   CONCAT17(ZeroL[7],CONCAT16(ZeroL[6],CONCAT15(ZeroL[5],CONCAT14(ZeroL[4],CONCAT13(
                                                  ZeroL[3],CONCAT12(ZeroL[2],CONCAT11(ZeroL[1],ZeroL
                                                  [0])))))));
              local_78[9] = ZeroL[9];
              local_78[8] = ZeroL[8];
              local_78[10] = ZeroL[10];
              local_78[0xb] = ZeroL[0xb];
              local_78[0xc] = ZeroL[0xc];
              local_78[0xd] = ZeroL[0xd];
              local_78[0xe] = ZeroL[0xe];
              local_78[0xf] = ZeroL[0xf];
              local_98[0] = (class_property<bool>)0x1;
              stack0xffffffffffffff70 = (element_type *)0x0;
              aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_50._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
              local_f8 = (string *)local_78;
              stack0xffffffffffffff48 = local_c0._9_8_ << 8;
              local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
              aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              aStack_b0._8_8_ = &local_f8;
              local_e8 = (string *)ZeroL;
              local_d8 = 0;
              local_e0 = &PTR__lazy_ostream_01389a00;
              local_d0 = boost::unit_test::lazy_ostream::inst;
              local_c8 = &local_e8;
              pvVar5 = (iterator)0x1;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48dcf,
                         (size_t)local_50,0x5d,local_c0,"ZeroL",&local_e0);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_88._M_allocated_capacity);
              local_4b8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_4b0 = "";
              local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_27.m_end = (iterator)0x5e;
              file_27.m_begin = (iterator)&local_4b8;
              msg_27.m_end = pvVar6;
              msg_27.m_begin = pvVar5;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                         (size_t)&local_4c8,msg_27);
              local_120.m_empty = false;
              local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
              local_110 = boost::unit_test::lazy_ostream::inst;
              local_108 = (string **)0xf4aea1;
              sStack_68.pi_._1_1_ = OneL[0x11];
              sStack_68.pi_._0_1_ = OneL[0x10];
              sStack_68.pi_._2_1_ = OneL[0x12];
              sStack_68.pi_._3_1_ = OneL[0x13];
              sStack_68.pi_._4_1_ = OneL[0x14];
              sStack_68.pi_._5_1_ = OneL[0x15];
              sStack_68.pi_._6_1_ = OneL[0x16];
              sStack_68.pi_._7_1_ = OneL[0x17];
              uStack_60 = CONCAT17(OneL[0x1f],
                                   CONCAT16(OneL[0x1e],
                                            CONCAT15(OneL[0x1d],
                                                     CONCAT14(OneL[0x1c],
                                                              CONCAT13(OneL[0x1b],
                                                                       CONCAT12(OneL[0x1a],
                                                                                CONCAT11(OneL[0x19],
                                                                                         OneL[0x18])
                                                                               ))))));
              local_78._0_8_ =
                   CONCAT17(OneL[7],CONCAT16(OneL[6],CONCAT15(OneL[5],CONCAT14(OneL[4],CONCAT13(OneL
                                                  [3],CONCAT12(OneL[2],CONCAT11(OneL[1],OneL[0])))))
                                            ));
              local_78[9] = OneL[9];
              local_78[8] = OneL[8];
              local_78[10] = OneL[10];
              local_78[0xb] = OneL[0xb];
              local_78[0xc] = OneL[0xc];
              local_78[0xd] = OneL[0xd];
              local_78[0xe] = OneL[0xe];
              local_78[0xf] = OneL[0xf];
              local_98[0] = (class_property<bool>)true;
              stack0xffffffffffffff70 = (element_type *)0x0;
              aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
              local_50._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
              local_f8 = (string *)local_78;
              stack0xffffffffffffff48 = local_c0._9_8_ << 8;
              local_c0._0_8_ = &PTR__lazy_ostream_01389a00;
              aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
              aStack_b0._8_8_ = &local_f8;
              local_e8 = (string *)OneL;
              local_d8 = 0;
              local_e0 = &PTR__lazy_ostream_01389a00;
              local_d0 = boost::unit_test::lazy_ostream::inst;
              local_c8 = &local_e8;
              pvVar5 = (iterator)0x1;
              pvVar6 = (iterator)0x2;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48dde,
                         (size_t)local_50,0x5e,local_c0,"OneL",&local_e0);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_88._M_allocated_capacity);
              local_4d8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
              ;
              local_4d0 = "";
              ppuVar4 = &local_4e8;
              local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_28.m_end = (iterator)0x60;
              file_28.m_begin = (iterator)&local_4d8;
              msg_28.m_end = pvVar6;
              msg_28.m_begin = pvVar5;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                         (size_t)ppuVar4,msg_28);
              local_120.m_empty = false;
              local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
              local_110 = boost::unit_test::lazy_ostream::inst;
              local_108 = (string **)0xf4aea1;
              base_blob<160u>::ToString_abi_cxx11_((string *)local_78,R1S);
              str_05._M_str = (char *)ppuVar4;
              str_05._M_len = local_78._0_8_;
              detail::FromHex<uint160>
                        ((optional<uint160> *)local_50,(detail *)local_78._8_8_,str_05);
              if (asStack_40[0].pi_._4_1_ == '\0') {
                if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                auVar24[0] = -((readonly_property<bool>)R1S[0] == local_50[0]);
                auVar24[1] = -(R1S[1] == local_50[1]);
                auVar24[2] = -(R1S[2] == local_50[2]);
                auVar24[3] = -(R1S[3] == local_50[3]);
                auVar24[4] = -(R1S[4] == local_50[4]);
                auVar24[5] = -(R1S[5] == local_50[5]);
                auVar24[6] = -(R1S[6] == local_50[6]);
                auVar24[7] = -(R1S[7] == local_50[7]);
                auVar24[8] = -(R1S[8] == local_50[8]);
                auVar24[9] = -(R1S[9] == cStack_47);
                auVar24[10] = -(R1S[10] == cStack_46);
                auVar24[0xb] = -(R1S[0xb] == cStack_45);
                auVar24[0xc] = -(R1S[0xc] == cStack_44);
                auVar24[0xd] = -(R1S[0xd] == cStack_43);
                auVar24[0xe] = -(R1S[0xe] == cStack_42);
                auVar24[0xf] = -(R1S[0xf] == cStack_41);
                auVar43[0] = -(R1S[0x10] == local_50[0x10]);
                auVar43[1] = -(R1S[0x11] == local_50[0x11]);
                auVar43[2] = -(R1S[0x12] == local_50[0x12]);
                auVar43[3] = -(R1S[0x13] == local_50[0x13]);
                auVar43[4] = 0xff;
                auVar43[5] = 0xff;
                auVar43[6] = 0xff;
                auVar43[7] = 0xff;
                auVar43[8] = 0xff;
                auVar43[9] = 0xff;
                auVar43[10] = 0xff;
                auVar43[0xb] = 0xff;
                auVar43[0xc] = 0xff;
                auVar43[0xd] = 0xff;
                auVar43[0xe] = 0xff;
                auVar43[0xf] = 0xff;
                auVar43 = auVar43 & auVar24;
                local_98[0] = (class_property<bool>)
                              (class_property<bool>)
                              ((ushort)((ushort)(SUB161(auVar43 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar43 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar43 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar43 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar43 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar43 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar43 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar43 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar43 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar43 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar43 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar43 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar43 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar43 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar43 >> 0x77,0) & 1) << 0xe |
                                       (ushort)(byte)(auVar43[0xf] >> 7) << 0xf) == 0xffff);
                stack0xffffffffffffff70 = (element_type *)0x0;
                aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
                local_f8 = (string *)0xf48b67;
                local_f0 = "";
                stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                aStack_b0._8_8_ = &local_e8;
                local_100 = (string *)R1S;
                local_d8 = 0;
                local_e0 = &PTR__lazy_ostream_0138e380;
                local_d0 = boost::unit_test::lazy_ostream::inst;
                local_c8 = &local_100;
                pvVar5 = (iterator)0x1;
                pvVar6 = (iterator)0x2;
                local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_50;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48dec,
                           (size_t)&local_f8,0x60,local_c0,"R1S",&local_e0);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_88._M_allocated_capacity);
                if ((shared_count *)local_78._0_8_ != &sStack_68) {
                  operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
                }
                local_4f8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                ;
                local_4f0 = "";
                ppuVar4 = &local_508;
                local_508 = &boost::unit_test::basic_cstring<char_const>::null;
                local_500 = &boost::unit_test::basic_cstring<char_const>::null;
                file_29.m_end = (iterator)0x61;
                file_29.m_begin = (iterator)&local_4f8;
                msg_29.m_end = pvVar6;
                msg_29.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                           (size_t)ppuVar4,msg_29);
                local_120.m_empty = false;
                local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                local_110 = boost::unit_test::lazy_ostream::inst;
                local_108 = (string **)0xf4aea1;
                base_blob<160u>::ToString_abi_cxx11_((string *)local_78,R2S);
                str_06._M_str = (char *)ppuVar4;
                str_06._M_len = local_78._0_8_;
                detail::FromHex<uint160>
                          ((optional<uint160> *)local_50,(detail *)local_78._8_8_,str_06);
                if (asStack_40[0].pi_._4_1_ == '\0') {
                  if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
                    std::__throw_bad_optional_access();
                  }
                }
                else {
                  auVar25[0] = -((readonly_property<bool>)R2S[0] == local_50[0]);
                  auVar25[1] = -(R2S[1] == local_50[1]);
                  auVar25[2] = -(R2S[2] == local_50[2]);
                  auVar25[3] = -(R2S[3] == local_50[3]);
                  auVar25[4] = -(R2S[4] == local_50[4]);
                  auVar25[5] = -(R2S[5] == local_50[5]);
                  auVar25[6] = -(R2S[6] == local_50[6]);
                  auVar25[7] = -(R2S[7] == local_50[7]);
                  auVar25[8] = -(R2S[8] == local_50[8]);
                  auVar25[9] = -(R2S[9] == cStack_47);
                  auVar25[10] = -(R2S[10] == cStack_46);
                  auVar25[0xb] = -(R2S[0xb] == cStack_45);
                  auVar25[0xc] = -(R2S[0xc] == cStack_44);
                  auVar25[0xd] = -(R2S[0xd] == cStack_43);
                  auVar25[0xe] = -(R2S[0xe] == cStack_42);
                  auVar25[0xf] = -(R2S[0xf] == cStack_41);
                  auVar44[0] = -(R2S[0x10] == local_50[0x10]);
                  auVar44[1] = -(R2S[0x11] == local_50[0x11]);
                  auVar44[2] = -(R2S[0x12] == local_50[0x12]);
                  auVar44[3] = -(R2S[0x13] == local_50[0x13]);
                  auVar44[4] = 0xff;
                  auVar44[5] = 0xff;
                  auVar44[6] = 0xff;
                  auVar44[7] = 0xff;
                  auVar44[8] = 0xff;
                  auVar44[9] = 0xff;
                  auVar44[10] = 0xff;
                  auVar44[0xb] = 0xff;
                  auVar44[0xc] = 0xff;
                  auVar44[0xd] = 0xff;
                  auVar44[0xe] = 0xff;
                  auVar44[0xf] = 0xff;
                  auVar44 = auVar44 & auVar25;
                  local_98[0] = (class_property<bool>)
                                (class_property<bool>)
                                ((ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) == 0xffff);
                  stack0xffffffffffffff70 = (element_type *)0x0;
                  aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
                  local_f8 = (string *)0xf48b67;
                  local_f0 = "";
                  stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                  local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                  aStack_b0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                  aStack_b0._8_8_ = &local_e8;
                  local_100 = (string *)R2S;
                  local_d8 = 0;
                  local_e0 = &PTR__lazy_ostream_0138e380;
                  local_d0 = boost::unit_test::lazy_ostream::inst;
                  local_c8 = &local_100;
                  pvVar5 = (iterator)0x1;
                  pvVar6 = (iterator)0x2;
                  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_50;
                  boost::test_tools::tt_detail::report_assertion
                            ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48e15,
                             (size_t)&local_f8,0x61,local_c0,"R2S",&local_e0);
                  boost::detail::shared_count::~shared_count
                            ((shared_count *)&aStack_88._M_allocated_capacity);
                  if ((shared_count *)local_78._0_8_ != &sStack_68) {
                    operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
                  }
                  local_518 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                  ;
                  local_510 = "";
                  ppuVar4 = &local_528;
                  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_30.m_end = (iterator)0x62;
                  file_30.m_begin = (iterator)&local_518;
                  msg_30.m_end = pvVar6;
                  msg_30.m_begin = pvVar5;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                             (size_t)ppuVar4,msg_30);
                  local_120.m_empty = false;
                  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                  local_110 = boost::unit_test::lazy_ostream::inst;
                  local_108 = (string **)0xf4aea1;
                  base_blob<160u>::ToString_abi_cxx11_((string *)local_78,ZeroS);
                  str_07._M_str = (char *)ppuVar4;
                  str_07._M_len = local_78._0_8_;
                  detail::FromHex<uint160>
                            ((optional<uint160> *)local_50,(detail *)local_78._8_8_,str_07);
                  if (asStack_40[0].pi_._4_1_ == '\0') {
                    if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
                      std::__throw_bad_optional_access();
                    }
                  }
                  else {
                    auVar26[0] = -((readonly_property<bool>)ZeroS[0] == local_50[0]);
                    auVar26[1] = -(ZeroS[1] == local_50[1]);
                    auVar26[2] = -(ZeroS[2] == local_50[2]);
                    auVar26[3] = -(ZeroS[3] == local_50[3]);
                    auVar26[4] = -(ZeroS[4] == local_50[4]);
                    auVar26[5] = -(ZeroS[5] == local_50[5]);
                    auVar26[6] = -(ZeroS[6] == local_50[6]);
                    auVar26[7] = -(ZeroS[7] == local_50[7]);
                    auVar26[8] = -(ZeroS[8] == local_50[8]);
                    auVar26[9] = -(ZeroS[9] == cStack_47);
                    auVar26[10] = -(ZeroS[10] == cStack_46);
                    auVar26[0xb] = -(ZeroS[0xb] == cStack_45);
                    auVar26[0xc] = -(ZeroS[0xc] == cStack_44);
                    auVar26[0xd] = -(ZeroS[0xd] == cStack_43);
                    auVar26[0xe] = -(ZeroS[0xe] == cStack_42);
                    auVar26[0xf] = -(ZeroS[0xf] == cStack_41);
                    auVar45[0] = -(ZeroS[0x10] == local_50[0x10]);
                    auVar45[1] = -(ZeroS[0x11] == local_50[0x11]);
                    auVar45[2] = -(ZeroS[0x12] == local_50[0x12]);
                    auVar45[3] = -(ZeroS[0x13] == local_50[0x13]);
                    auVar45[4] = 0xff;
                    auVar45[5] = 0xff;
                    auVar45[6] = 0xff;
                    auVar45[7] = 0xff;
                    auVar45[8] = 0xff;
                    auVar45[9] = 0xff;
                    auVar45[10] = 0xff;
                    auVar45[0xb] = 0xff;
                    auVar45[0xc] = 0xff;
                    auVar45[0xd] = 0xff;
                    auVar45[0xe] = 0xff;
                    auVar45[0xf] = 0xff;
                    auVar45 = auVar45 & auVar26;
                    local_98[0] = (class_property<bool>)
                                  (class_property<bool>)
                                  ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                                           (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) == 0xffff);
                    stack0xffffffffffffff70 = (element_type *)0x0;
                    aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
                    local_f8 = (string *)0xf48b67;
                    local_f0 = "";
                    stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                    local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                    aStack_b0._M_allocated_capacity =
                         (size_type)boost::unit_test::lazy_ostream::inst;
                    aStack_b0._8_8_ = &local_e8;
                    local_100 = (string *)ZeroS;
                    local_d8 = 0;
                    local_e0 = &PTR__lazy_ostream_0138e380;
                    local_d0 = boost::unit_test::lazy_ostream::inst;
                    local_c8 = &local_100;
                    pvVar5 = (iterator)0x1;
                    pvVar6 = (iterator)0x2;
                    local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50;
                    boost::test_tools::tt_detail::report_assertion
                              ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48e3e,
                               (size_t)&local_f8,0x62,local_c0,"ZeroS",&local_e0);
                    boost::detail::shared_count::~shared_count
                              ((shared_count *)&aStack_88._M_allocated_capacity);
                    if ((shared_count *)local_78._0_8_ != &sStack_68) {
                      operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
                    }
                    local_538 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                    ;
                    local_530 = "";
                    ppuVar4 = &local_548;
                    local_548 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_31.m_end = (iterator)0x63;
                    file_31.m_begin = (iterator)&local_538;
                    msg_31.m_end = pvVar6;
                    msg_31.m_begin = pvVar5;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                               (size_t)ppuVar4,msg_31);
                    local_120.m_empty = false;
                    local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                    local_110 = boost::unit_test::lazy_ostream::inst;
                    local_108 = (string **)0xf4aea1;
                    base_blob<160u>::ToString_abi_cxx11_((string *)local_78,OneS);
                    str_08._M_str = (char *)ppuVar4;
                    str_08._M_len = local_78._0_8_;
                    detail::FromHex<uint160>
                              ((optional<uint160> *)local_50,(detail *)local_78._8_8_,str_08);
                    if (asStack_40[0].pi_._4_1_ == '\0') {
                      if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_) {
                        std::__throw_bad_optional_access();
                      }
                    }
                    else {
                      auVar27[0] = -((readonly_property<bool>)OneS[0] == local_50[0]);
                      auVar27[1] = -(OneS[1] == local_50[1]);
                      auVar27[2] = -(OneS[2] == local_50[2]);
                      auVar27[3] = -(OneS[3] == local_50[3]);
                      auVar27[4] = -(OneS[4] == local_50[4]);
                      auVar27[5] = -(OneS[5] == local_50[5]);
                      auVar27[6] = -(OneS[6] == local_50[6]);
                      auVar27[7] = -(OneS[7] == local_50[7]);
                      auVar27[8] = -(OneS[8] == local_50[8]);
                      auVar27[9] = -(OneS[9] == cStack_47);
                      auVar27[10] = -(OneS[10] == cStack_46);
                      auVar27[0xb] = -(OneS[0xb] == cStack_45);
                      auVar27[0xc] = -(OneS[0xc] == cStack_44);
                      auVar27[0xd] = -(OneS[0xd] == cStack_43);
                      auVar27[0xe] = -(OneS[0xe] == cStack_42);
                      auVar27[0xf] = -(OneS[0xf] == cStack_41);
                      auVar46[0] = -(OneS[0x10] == local_50[0x10]);
                      auVar46[1] = -(OneS[0x11] == local_50[0x11]);
                      auVar46[2] = -(OneS[0x12] == local_50[0x12]);
                      auVar46[3] = -(OneS[0x13] == local_50[0x13]);
                      auVar46[4] = 0xff;
                      auVar46[5] = 0xff;
                      auVar46[6] = 0xff;
                      auVar46[7] = 0xff;
                      auVar46[8] = 0xff;
                      auVar46[9] = 0xff;
                      auVar46[10] = 0xff;
                      auVar46[0xb] = 0xff;
                      auVar46[0xc] = 0xff;
                      auVar46[0xd] = 0xff;
                      auVar46[0xe] = 0xff;
                      auVar46[0xf] = 0xff;
                      auVar46 = auVar46 & auVar27;
                      local_98[0] = (class_property<bool>)
                                    (class_property<bool>)
                                    ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                              (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                              (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                              (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                              (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                              (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                              (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                              (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                              (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                              (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                              (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                              (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                              (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                              (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                                             (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) == 0xffff);
                      stack0xffffffffffffff70 = (element_type *)0x0;
                      aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
                      local_f8 = (string *)0xf48b67;
                      local_f0 = "";
                      stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                      local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                      aStack_b0._M_allocated_capacity =
                           (size_type)boost::unit_test::lazy_ostream::inst;
                      local_100 = (string *)OneS;
                      local_d8 = 0;
                      local_e0 = &PTR__lazy_ostream_0138e380;
                      local_d0 = boost::unit_test::lazy_ostream::inst;
                      local_c8 = &local_100;
                      pvVar5 = (iterator)0x1;
                      pvVar6 = (iterator)0x2;
                      local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_50;
                      aStack_b0._8_8_ = &local_e8;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48e69,
                                 (size_t)&local_f8,99,local_c0,"OneS",&local_e0);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&aStack_88._M_allocated_capacity);
                      if ((shared_count *)local_78._0_8_ != &sStack_68) {
                        operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
                      }
                      local_558 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                      ;
                      local_550 = "";
                      ppuVar4 = &local_568;
                      local_568 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_560 = &boost::unit_test::basic_cstring<char_const>::null;
                      file_32.m_end = (iterator)0x64;
                      file_32.m_begin = (iterator)&local_558;
                      msg_32.m_end = pvVar6;
                      msg_32.m_begin = pvVar5;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,
                                 (size_t)ppuVar4,msg_32);
                      local_120.m_empty = false;
                      local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                      local_110 = boost::unit_test::lazy_ostream::inst;
                      local_108 = (string **)0xf4aea1;
                      base_blob<160u>::ToString_abi_cxx11_((string *)local_78,MaxS);
                      str_09._M_str = (char *)ppuVar4;
                      str_09._M_len = local_78._0_8_;
                      detail::FromHex<uint160>
                                ((optional<uint160> *)local_50,(detail *)local_78._8_8_,str_09);
                      if (asStack_40[0].pi_._4_1_ == '\0') {
                        if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_)
                        {
                          std::__throw_bad_optional_access();
                        }
                      }
                      else {
                        auVar28[0] = -((readonly_property<bool>)MaxS[0] == local_50[0]);
                        auVar28[1] = -(MaxS[1] == local_50[1]);
                        auVar28[2] = -(MaxS[2] == local_50[2]);
                        auVar28[3] = -(MaxS[3] == local_50[3]);
                        auVar28[4] = -(MaxS[4] == local_50[4]);
                        auVar28[5] = -(MaxS[5] == local_50[5]);
                        auVar28[6] = -(MaxS[6] == local_50[6]);
                        auVar28[7] = -(MaxS[7] == local_50[7]);
                        auVar28[8] = -(MaxS[8] == local_50[8]);
                        auVar28[9] = -(MaxS[9] == cStack_47);
                        auVar28[10] = -(MaxS[10] == cStack_46);
                        auVar28[0xb] = -(MaxS[0xb] == cStack_45);
                        auVar28[0xc] = -(MaxS[0xc] == cStack_44);
                        auVar28[0xd] = -(MaxS[0xd] == cStack_43);
                        auVar28[0xe] = -(MaxS[0xe] == cStack_42);
                        auVar28[0xf] = -(MaxS[0xf] == cStack_41);
                        auVar47[0] = -(MaxS[0x10] == local_50[0x10]);
                        auVar47[1] = -(MaxS[0x11] == local_50[0x11]);
                        auVar47[2] = -(MaxS[0x12] == local_50[0x12]);
                        auVar47[3] = -(MaxS[0x13] == local_50[0x13]);
                        auVar47[4] = 0xff;
                        auVar47[5] = 0xff;
                        auVar47[6] = 0xff;
                        auVar47[7] = 0xff;
                        auVar47[8] = 0xff;
                        auVar47[9] = 0xff;
                        auVar47[10] = 0xff;
                        auVar47[0xb] = 0xff;
                        auVar47[0xc] = 0xff;
                        auVar47[0xd] = 0xff;
                        auVar47[0xe] = 0xff;
                        auVar47[0xf] = 0xff;
                        auVar47 = auVar47 & auVar28;
                        local_98[0] = (class_property<bool>)
                                      (class_property<bool>)
                                      ((ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                                                (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe |
                                               (ushort)(byte)(auVar47[0xf] >> 7) << 0xf) == 0xffff);
                        stack0xffffffffffffff70 = (element_type *)0x0;
                        aStack_88._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
                        local_f8 = (string *)0xf48b67;
                        local_f0 = "";
                        stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                        local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                        aStack_b0._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        local_100 = (string *)MaxS;
                        local_d8 = 0;
                        local_e0 = &PTR__lazy_ostream_0138e380;
                        local_d0 = boost::unit_test::lazy_ostream::inst;
                        local_c8 = &local_100;
                        pvVar5 = (iterator)0x1;
                        pvVar6 = (iterator)0x2;
                        local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_50;
                        aStack_b0._8_8_ = &local_e8;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_98,&local_120,1,2,REQUIRE,0xf48e93,
                                   (size_t)&local_f8,100,local_c0,"MaxS",&local_e0);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&aStack_88._M_allocated_capacity);
                        if ((shared_count *)local_78._0_8_ != &sStack_68) {
                          operator_delete((void *)local_78._0_8_,(long)sStack_68.pi_ + 1);
                        }
                        local_578 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                        ;
                        local_570 = "";
                        ppuVar4 = &local_588;
                        local_588 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_580 = &boost::unit_test::basic_cstring<char_const>::null;
                        file_33.m_end = (iterator)0x65;
                        file_33.m_begin = (iterator)&local_578;
                        msg_33.m_end = pvVar6;
                        msg_33.m_begin = pvVar5;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                                   (size_t)ppuVar4,msg_33);
                        local_120.m_empty = false;
                        local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                        local_110 = boost::unit_test::lazy_ostream::inst;
                        local_108 = (string **)0xf4aea1;
                        str_10._M_str = (char *)ppuVar4;
                        str_10._M_len = 0xf49dc8;
                        detail::FromHex<uint160>
                                  ((optional<uint160> *)local_98,(detail *)&DAT_00000028,str_10);
                        if (aStack_88._M_local_buf[4] == '\0') {
                          if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_
                             ) {
                            std::__throw_bad_optional_access();
                          }
                        }
                        else {
                          auVar9[0] = -(R1S[0] == local_98[0]);
                          auVar9[1] = -(R1S[1] == local_98[1]);
                          auVar9[2] = -(R1S[2] == local_98[2]);
                          auVar9[3] = -(R1S[3] == local_98[3]);
                          auVar9[4] = -(R1S[4] == local_98[4]);
                          auVar9[5] = -(R1S[5] == local_98[5]);
                          auVar9[6] = -(R1S[6] == local_98[6]);
                          auVar9[7] = -(R1S[7] == local_98[7]);
                          auVar9[8] = -(R1S[8] == local_98[8]);
                          auVar9[9] = -(R1S[9] == cStack_8f);
                          auVar9[10] = -(R1S[10] == cStack_8e);
                          auVar9[0xb] = -(R1S[0xb] == cStack_8d);
                          auVar9[0xc] = -(R1S[0xc] == cStack_8c);
                          auVar9[0xd] = -(R1S[0xd] == cStack_8b);
                          auVar9[0xe] = -(R1S[0xe] == cStack_8a);
                          auVar9[0xf] = -(R1S[0xf] == cStack_89);
                          auVar48[0] = -(R1S[0x10] == local_98[0x10]);
                          auVar48[1] = -(R1S[0x11] == local_98[0x11]);
                          auVar48[2] = -(R1S[0x12] == local_98[0x12]);
                          auVar48[3] = -(R1S[0x13] == local_98[0x13]);
                          auVar48[4] = 0xff;
                          auVar48[5] = 0xff;
                          auVar48[6] = 0xff;
                          auVar48[7] = 0xff;
                          auVar48[8] = 0xff;
                          auVar48[9] = 0xff;
                          auVar48[10] = 0xff;
                          auVar48[0xb] = 0xff;
                          auVar48[0xc] = 0xff;
                          auVar48[0xd] = 0xff;
                          auVar48[0xe] = 0xff;
                          auVar48[0xf] = 0xff;
                          auVar9 = auVar9 & auVar48;
                          local_78._8_8_ = (element_type *)0x0;
                          sStack_68.pi_ = (sp_counted_base *)0x0;
                          local_50._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
                          stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                          local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                          aStack_b0._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          local_e8 = (string *)R1S;
                          local_d8 = 0;
                          local_e0 = &PTR__lazy_ostream_0138e380;
                          local_d0 = boost::unit_test::lazy_ostream::inst;
                          pvVar5 = (iterator)0x1;
                          pvVar6 = (iterator)0x2;
                          local_f8 = (string *)local_98;
                          local_c8 = &local_e8;
                          aStack_b0._8_8_ = &local_f8;
                          local_78[0] = (class_property<bool>)
                                        (class_property<bool>)
                                        ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                                  (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                                 (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff)
                          ;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_78,&local_120,1,2,REQUIRE,0xf48ebd,
                                     (size_t)local_50,0x65,local_c0,"R1S",&local_e0);
                          boost::detail::shared_count::~shared_count(&sStack_68);
                          local_598 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_590 = "";
                          local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_34.m_end = (iterator)0x67;
                          file_34.m_begin = (iterator)&local_598;
                          msg_34.m_end = pvVar6;
                          msg_34.m_begin = pvVar5;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,
                                     (size_t)&local_5a8,msg_34);
                          local_120.m_empty = false;
                          local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                          local_110 = boost::unit_test::lazy_ostream::inst;
                          local_108 = (string **)0xf4aea1;
                          aStack_88._M_allocated_capacity._0_4_ = R1S._16_4_;
                          sVar1 = stack0xffffffffffffff70;
                          local_98._0_8_ =
                               CONCAT17(R1S[7],CONCAT16(R1S[6],CONCAT15(R1S[5],CONCAT14(R1S[4],
                                                  CONCAT13(R1S[3],CONCAT12(R1S[2],CONCAT11(R1S[1],
                                                  R1S[0])))))));
                          cStack_8f = R1S[9];
                          local_98[8] = R1S[8];
                          cStack_8e = R1S[10];
                          cStack_8d = R1S[0xb];
                          cStack_8c = R1S[0xc];
                          cStack_8b = R1S[0xd];
                          cStack_8a = R1S[0xe];
                          cStack_89 = R1S[0xf];
                          aStack_88._M_allocated_capacity = (size_type)sVar1.pn.pi_;
                          local_78[0] = (class_property<bool>)0x1;
                          local_78._8_8_ = (element_type *)0x0;
                          sStack_68.pi_ = (sp_counted_base *)0x0;
                          local_50._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
                          local_f8 = (string *)local_98;
                          stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                          local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                          aStack_b0._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          aStack_b0._8_8_ = &local_f8;
                          local_e8 = (string *)R1S;
                          local_d8 = 0;
                          local_e0 = &PTR__lazy_ostream_0138e380;
                          local_d0 = boost::unit_test::lazy_ostream::inst;
                          local_c8 = &local_e8;
                          pvVar5 = (iterator)0x1;
                          pvVar6 = (iterator)0x2;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_78,&local_120,1,2,REQUIRE,0xf48efd,
                                     (size_t)local_50,0x67,local_c0,"R1S",&local_e0);
                          boost::detail::shared_count::~shared_count(&sStack_68);
                          local_5b8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_5b0 = "";
                          local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_35.m_end = &DAT_00000068;
                          file_35.m_begin = (iterator)&local_5b8;
                          msg_35.m_end = pvVar6;
                          msg_35.m_begin = pvVar5;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
                                     (size_t)&local_5c8,msg_35);
                          local_120.m_empty = false;
                          local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                          local_110 = boost::unit_test::lazy_ostream::inst;
                          local_108 = (string **)0xf4aea1;
                          aStack_88._M_allocated_capacity._0_4_ = ZeroS._16_4_;
                          sVar1 = stack0xffffffffffffff70;
                          local_98._0_8_ =
                               CONCAT17(ZeroS[7],CONCAT16(ZeroS[6],CONCAT15(ZeroS[5],CONCAT14(ZeroS[
                                                  4],CONCAT13(ZeroS[3],CONCAT12(ZeroS[2],CONCAT11(
                                                  ZeroS[1],ZeroS[0])))))));
                          cStack_8f = ZeroS[9];
                          local_98[8] = ZeroS[8];
                          cStack_8e = ZeroS[10];
                          cStack_8d = ZeroS[0xb];
                          cStack_8c = ZeroS[0xc];
                          cStack_8b = ZeroS[0xd];
                          cStack_8a = ZeroS[0xe];
                          cStack_89 = ZeroS[0xf];
                          aStack_88._M_allocated_capacity = (size_type)sVar1.pn.pi_;
                          local_78[0] = (class_property<bool>)0x1;
                          local_78._8_8_ = (element_type *)0x0;
                          sStack_68.pi_ = (sp_counted_base *)0x0;
                          local_50._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
                          local_f8 = (string *)local_98;
                          stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                          local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                          aStack_b0._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          aStack_b0._8_8_ = &local_f8;
                          local_e8 = (string *)ZeroS;
                          local_d8 = 0;
                          local_e0 = &PTR__lazy_ostream_0138e380;
                          local_d0 = boost::unit_test::lazy_ostream::inst;
                          local_c8 = &local_e8;
                          pvVar5 = (iterator)0x1;
                          pvVar6 = (iterator)0x2;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_78,&local_120,1,2,REQUIRE,0xf48f0a,
                                     (size_t)local_50,0x68,local_c0,"ZeroS",&local_e0);
                          boost::detail::shared_count::~shared_count(&sStack_68);
                          local_5d8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          local_5d0 = "";
                          local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
                          file_36.m_end = (iterator)0x69;
                          file_36.m_begin = (iterator)&local_5d8;
                          msg_36.m_end = pvVar6;
                          msg_36.m_begin = pvVar5;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,
                                     (size_t)&local_5e8,msg_36);
                          local_120.m_empty = false;
                          local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01388f08;
                          local_110 = boost::unit_test::lazy_ostream::inst;
                          local_108 = (string **)0xf4aea1;
                          aStack_88._M_allocated_capacity._0_4_ = OneS._16_4_;
                          sVar1 = stack0xffffffffffffff70;
                          local_98._0_8_ =
                               CONCAT17(OneS[7],CONCAT16(OneS[6],CONCAT15(OneS[5],CONCAT14(OneS[4],
                                                  CONCAT13(OneS[3],CONCAT12(OneS[2],CONCAT11(OneS[1]
                                                  ,OneS[0])))))));
                          cStack_8f = OneS[9];
                          local_98[8] = OneS[8];
                          cStack_8e = OneS[10];
                          cStack_8d = OneS[0xb];
                          cStack_8c = OneS[0xc];
                          cStack_8b = OneS[0xd];
                          cStack_8a = OneS[0xe];
                          cStack_89 = OneS[0xf];
                          aStack_88._M_allocated_capacity = (size_type)sVar1.pn.pi_;
                          local_78[0] = (class_property<bool>)true;
                          local_78._8_8_ = (element_type *)0x0;
                          sStack_68.pi_ = (sp_counted_base *)0x0;
                          local_50._0_8_ =
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
                          ;
                          stack0xffffffffffffffb8 = (element_type *)0xf48bcd;
                          local_f8 = (string *)local_98;
                          stack0xffffffffffffff48 = local_c0._9_8_ << 8;
                          local_c0._0_8_ = &PTR__lazy_ostream_0138e380;
                          aStack_b0._M_allocated_capacity =
                               (size_type)boost::unit_test::lazy_ostream::inst;
                          aStack_b0._8_8_ = &local_f8;
                          local_e8 = (string *)OneS;
                          local_d8 = 0;
                          local_e0 = &PTR__lazy_ostream_0138e380;
                          local_d0 = boost::unit_test::lazy_ostream::inst;
                          local_c8 = &local_e8;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_78,&local_120,1,2,REQUIRE,0xf48f19,
                                     (size_t)local_50,0x69,local_c0,"OneS",&local_e0);
                          boost::detail::shared_count::~shared_count(&sStack_68);
                          if ((sp_counted_base *)*(long *)(in_FS_OFFSET + 0x28) == asStack_40[1].pi_
                             ) {
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE( basics ) // constructors, equality, inequality
{
    // constructor uint256(vector<char>):
    BOOST_CHECK_EQUAL(R1L.ToString(), ArrayToString(R1Array,32));
    BOOST_CHECK_EQUAL(R1S.ToString(), ArrayToString(R1Array,20));
    BOOST_CHECK_EQUAL(R2L.ToString(), ArrayToString(R2Array,32));
    BOOST_CHECK_EQUAL(R2S.ToString(), ArrayToString(R2Array,20));
    BOOST_CHECK_EQUAL(ZeroL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_EQUAL(ZeroS.ToString(), ArrayToString(ZeroArray,20));
    BOOST_CHECK_EQUAL(OneL.ToString(), ArrayToString(OneArray,32));
    BOOST_CHECK_EQUAL(OneS.ToString(), ArrayToString(OneArray,20));
    BOOST_CHECK_EQUAL(MaxL.ToString(), ArrayToString(MaxArray,32));
    BOOST_CHECK_EQUAL(MaxS.ToString(), ArrayToString(MaxArray,20));
    BOOST_CHECK_NE(OneL.ToString(), ArrayToString(ZeroArray,32));
    BOOST_CHECK_NE(OneS.ToString(), ArrayToString(ZeroArray,20));

    // == and !=
    BOOST_CHECK_NE(R1L, R2L); BOOST_CHECK_NE(R1S, R2S);
    BOOST_CHECK_NE(ZeroL, OneL); BOOST_CHECK_NE(ZeroS, OneS);
    BOOST_CHECK_NE(OneL, ZeroL); BOOST_CHECK_NE(OneS, ZeroS);
    BOOST_CHECK_NE(MaxL, ZeroL); BOOST_CHECK_NE(MaxS, ZeroS);

    // String Constructor and Copy Constructor
    BOOST_CHECK_EQUAL(uint256::FromHex(R1L.ToString()).value(), R1L);
    BOOST_CHECK_EQUAL(uint256::FromHex(R2L.ToString()).value(), R2L);
    BOOST_CHECK_EQUAL(uint256::FromHex(ZeroL.ToString()).value(), ZeroL);
    BOOST_CHECK_EQUAL(uint256::FromHex(OneL.ToString()).value(), OneL);
    BOOST_CHECK_EQUAL(uint256::FromHex(MaxL.ToString()).value(), MaxL);
    BOOST_CHECK_EQUAL(uint256::FromHex(R1ArrayHex).value(), R1L);
    BOOST_CHECK_EQUAL(uint256(R1L), R1L);
    BOOST_CHECK_EQUAL(uint256(ZeroL), ZeroL);
    BOOST_CHECK_EQUAL(uint256(OneL), OneL);

    BOOST_CHECK_EQUAL(uint160::FromHex(R1S.ToString()).value(), R1S);
    BOOST_CHECK_EQUAL(uint160::FromHex(R2S.ToString()).value(), R2S);
    BOOST_CHECK_EQUAL(uint160::FromHex(ZeroS.ToString()).value(), ZeroS);
    BOOST_CHECK_EQUAL(uint160::FromHex(OneS.ToString()).value(), OneS);
    BOOST_CHECK_EQUAL(uint160::FromHex(MaxS.ToString()).value(), MaxS);
    BOOST_CHECK_EQUAL(uint160::FromHex(std::string_view{R1ArrayHex + 24, 40}).value(), R1S);

    BOOST_CHECK_EQUAL(uint160(R1S), R1S);
    BOOST_CHECK_EQUAL(uint160(ZeroS), ZeroS);
    BOOST_CHECK_EQUAL(uint160(OneS), OneS);
}